

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

Error efsw::Errors::Log::createLastError(Error err,string *log)

{
  long *plVar1;
  long *plVar2;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(err) {
  case WatcherFailed:
    std::operator+(&local_38,"File system watcher failed ( ",log);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    break;
  case FileRemote:
    std::operator+(&local_38,"File is located in a remote file system, use a generic watcher. ( ",
                   log);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    break;
  default:
    std::__cxx11::string::_M_assign((string *)&LastError_abi_cxx11_);
    return err;
  case FileOutOfScope:
    std::operator+(&local_38,"Symlink file out of scope ( ",log);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    break;
  case FileRepeated:
    std::operator+(&local_38,"File repeated in watches ( ",log);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    break;
  case FileNotFound:
    std::operator+(&local_38,"File not found ( ",log);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
  }
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  local_50 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&LastError_abi_cxx11_,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return err;
}

Assistant:

Error Log::createLastError( Error err, std::string log ) {
	switch ( err ) {
		case FileNotFound:
			LastError = "File not found ( " + log + " )";
			break;
		case FileRepeated:
			LastError = "File repeated in watches ( " + log + " )";
			break;
		case FileOutOfScope:
			LastError = "Symlink file out of scope ( " + log + " )";
			break;
		case FileRemote:
			LastError =
				"File is located in a remote file system, use a generic watcher. ( " + log + " )";
			break;
		case WatcherFailed:
			LastError = "File system watcher failed ( " + log + " )";
			break;
		case Unspecified:
		default:
			LastError = log;
	}

	efDEBUG( "%s\n", LastError.c_str() );
	return err;
}